

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O1

bool __thiscall MT32Emu::Part::abortFirstPoly(Part *this,uint key)

{
  byte bVar1;
  uint uVar2;
  Poly *in_RAX;
  Poly *this_00;
  
  this_00 = (this->activePolys).firstPoly;
  do {
    if (this_00 == (Poly *)0x0) {
      bVar1 = (byte)in_RAX;
LAB_0011c391:
      return (bool)(this_00 != (Poly *)0x0 & bVar1);
    }
    uVar2 = Poly::getKey(this_00);
    if (uVar2 == key) {
      bVar1 = Poly::startAbort(this_00);
      goto LAB_0011c391;
    }
    this_00 = Poly::getNext(this_00);
    in_RAX = this_00;
  } while( true );
}

Assistant:

Poly *PolyList::getFirst() const {
	return firstPoly;
}